

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O0

void helper_rfid(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  do_rfi(env,env->spr[0x1a],env->spr[0x1b]);
  return;
}

Assistant:

void helper_rfid(CPUPPCState *env)
{
    /*
     * The architeture defines a number of rules for which bits can
     * change but in practice, we handle this in hreg_store_msr()
     * which will be called by do_rfi(), so there is no need to filter
     * here
     */
    do_rfi(env, env->spr[SPR_SRR0], env->spr[SPR_SRR1]);
}